

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O1

Point2D __thiscall
lazyTrees::LazyKdTree<Point2D>::nearest(LazyKdTree<Point2D> *this,Point2D *search)

{
  double dVar1;
  Point2D *pPVar2;
  double dVar3;
  double *pdVar4;
  LazyKdTree<Point2D> *pLVar5;
  size_t i;
  size_t sVar6;
  size_t i_1;
  Point2D *this_00;
  double dVar7;
  Point2D PVar8;
  Point2D otherBest;
  Point2D local_58;
  double local_48;
  double local_40;
  Point2D local_38;
  
  ensure_evaluated(this);
  this_00 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
            super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
            super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
  if ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0 &&
      (this->childNegative)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0) goto LAB_001448be;
  sVar6 = this->dim;
  pdVar4 = Point2D::operator[](search,sVar6);
  dVar1 = *pdVar4;
  pdVar4 = Point2D::operator[](this_00,sVar6);
  local_48 = *pdVar4;
  local_58.x = 0.0;
  local_58.y = 0.0;
  if (dVar1 <= local_48) {
    pLVar5 = (this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar5 != (LazyKdTree<Point2D> *)0x0) goto LAB_001446b7;
    if (local_48 < dVar1) goto LAB_0014469c;
  }
  else {
LAB_0014469c:
    pLVar5 = (this->childPositive)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar5 != (LazyKdTree<Point2D> *)0x0) {
LAB_001446b7:
      PVar8 = nearest(pLVar5,search);
      local_58.y = PVar8.y;
      this_00 = &local_58;
      local_58.x = PVar8.x;
      dVar3 = 0.0;
      sVar6 = 0;
      do {
        pdVar4 = Point2D::operator[](search,sVar6);
        dVar7 = *pdVar4;
        pdVar4 = Point2D::operator[](this_00,sVar6);
        dVar3 = dVar3 + (dVar7 - *pdVar4) * (dVar7 - *pdVar4);
        sVar6 = sVar6 + 1;
      } while (sVar6 == 1);
      pPVar2 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
               super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
               super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
      dVar7 = 0.0;
      sVar6 = 0;
      do {
        pdVar4 = Point2D::operator[](search,sVar6);
        local_40 = *pdVar4;
        pdVar4 = Point2D::operator[](pPVar2,sVar6);
        dVar7 = dVar7 + (local_40 - *pdVar4) * (local_40 - *pdVar4);
        sVar6 = sVar6 + 1;
      } while (sVar6 == 1);
      if (dVar7 < dVar3) {
        pPVar2 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                 _M_t.super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                 super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
        local_58.x = pPVar2->x;
        local_58.y = pPVar2->y;
        dVar3 = dVar7;
      }
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      pdVar4 = Point2D::operator[](search,this->dim);
      dVar7 = *pdVar4;
      pdVar4 = Point2D::operator[](search,this->dim);
      if ((local_48 < dVar1) ||
         ((this->childPositive)._M_t.
          super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
          .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
          (LazyKdTree<Point2D> *)0x0)) {
        if ((dVar1 <= local_48) ||
           (((this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
             (LazyKdTree<Point2D> *)0x0 ||
            (pdVar4 = Point2D::operator[]((this->data)._M_t.
                                          super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>
                                          .super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,
                                          this->dim), *pdVar4 < dVar7 - dVar3)))) goto LAB_001448be;
        pLVar5 = (this->childNegative)._M_t.
                 super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
      }
      else {
        dVar1 = *pdVar4;
        pdVar4 = Point2D::operator[]((this->data)._M_t.
                                     super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>
                                     .super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim
                                    );
        if (dVar3 + dVar1 < *pdVar4) goto LAB_001448be;
        pLVar5 = (this->childPositive)._M_t.
                 super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
      }
      PVar8 = nearest(pLVar5,search);
      local_38.y = PVar8.y;
      local_38.x = PVar8.x;
      dVar1 = square_dist(search,&local_38);
      this_00 = &local_58;
      dVar3 = square_dist(search,this_00);
      if (dVar1 < dVar3) {
        local_58.x = local_38.x;
        local_58.y = local_38.y;
      }
      goto LAB_001448be;
    }
  }
  this_00 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
            super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
            super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
LAB_001448be:
  return *this_00;
}

Assistant:

P nearest(P const& search)
    {
        ensure_evaluated();

        if (is_leaf())
            return *data.get(); // reached the end, return current value

        const auto comp = dimension_compare(search, *data.get(), dim);

        P best; // nearest neighbor of search

        if (comp == NEGATIVE && childNegative)
            best = childNegative->nearest(search);
        else if (comp == POSITIVE && childPositive)
            best = childPositive->nearest(search);
        else
            return *data.get();

        double sqrDistanceBest = square_dist(search, best);
        const double sqrDistanceThis = square_dist(search, *data.get());

        if (sqrDistanceThis < sqrDistanceBest) {
            sqrDistanceBest = sqrDistanceThis;
            best = *data.get(); // make this value the best if it is closer than the
            // checked side
            // type
        }

        // check whether other side might have candidates as well
        const double distanceBest   = std::sqrt(sqrDistanceBest);
        const double borderNegative = search[dim] - distanceBest;
        const double borderPositive = search[dim] + distanceBest;

        // check whether distances to other side are smaller than currently best
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim]) {
                const auto otherBest = childPositive->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim]) {
                const auto otherBest = childNegative->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        }

        return best;
    }